

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O1

PAL_ERROR FILELockFileRegion(SHMPTR shmFileLocks,PVOID pvControllerInstance,UINT64 lockRgnStart,
                            UINT64 nbBytesToLock,LOCK_TYPE lockAction)

{
  DWORD DVar1;
  PAL_ERROR PVar2;
  SHMFILELOCKS *fileLocks;
  SHMFILELOCKRGNS *pSVar3;
  ulong uVar4;
  SHMFILELOCKRGNS *pSVar5;
  undefined8 uVar6;
  SHMFILELOCKRGNS *pSVar7;
  bool bVar8;
  undefined1 auStack_78 [8];
  SHMFILELOCKRGNS fakeLock;
  
  fakeLock.nbBytesLocked = 0;
  fakeLock.lockType = USER_LOCK_RGN;
  fakeLock._36_4_ = 0;
  fakeLock.pvControllerInstance = (PVOID)0x0;
  fakeLock.lockRgnStart = 0;
  auStack_78 = (undefined1  [8])0x0;
  fakeLock.processId = 0;
  fakeLock._4_4_ = 0;
  SHMLock();
  if (nbBytesToLock != 0) {
    if (shmFileLocks == 0) {
      fileLocks = (SHMFILELOCKS *)0x0;
      bVar8 = false;
    }
    else {
      fileLocks = (SHMFILELOCKS *)SHMPtrToPtr(shmFileLocks);
      bVar8 = fileLocks == (SHMFILELOCKS *)0x0;
    }
    uVar6 = 0x1e0;
    if (fileLocks != (SHMFILELOCKS *)0x0 && !bVar8) {
      if (fileLocks->fileLockedRgns == 0) {
        pSVar3 = (SHMFILELOCKRGNS *)0x0;
LAB_0012aa12:
        PVar2 = FILEAddNewLockedRgn(fileLocks,pvControllerInstance,pSVar3,lockRgnStart,nbBytesToLock
                                    ,lockAction);
        if (PVar2 == 0) goto LAB_0012aa37;
        goto LAB_0012aa32;
      }
      pSVar3 = (SHMFILELOCKRGNS *)SHMPtrToPtr(fileLocks->fileLockedRgns);
      if (pSVar3 == (SHMFILELOCKRGNS *)0x0) {
        uVar6 = 0x1ec;
      }
      else {
        DVar1 = GetCurrentProcessId();
        if (lockRgnStart < pSVar3->nbBytesLocked + pSVar3->lockRgnStart) {
          pSVar5 = (SHMFILELOCKRGNS *)auStack_78;
        }
        else {
          do {
            pSVar5 = pSVar3;
            if (pSVar5->next == 0) {
              pSVar3 = (SHMFILELOCKRGNS *)0x0;
              bVar8 = false;
            }
            else {
              pSVar3 = (SHMFILELOCKRGNS *)SHMPtrToPtr(pSVar5->next);
              bVar8 = pSVar3 == (SHMFILELOCKRGNS *)0x0;
            }
            if (bVar8) {
              uVar6 = 0x1fc;
              goto LAB_0012a804;
            }
          } while ((pSVar3 != (SHMFILELOCKRGNS *)0x0) &&
                  (pSVar3->nbBytesLocked + pSVar3->lockRgnStart <= lockRgnStart));
        }
        if (pSVar3 != (SHMFILELOCKRGNS *)0x0) {
          fakeLock.next = nbBytesToLock + lockRgnStart;
          uVar4 = pSVar3->lockRgnStart;
          pSVar7 = pSVar3;
          if (uVar4 < fakeLock.next) {
            while (pSVar3 = pSVar7, lockRgnStart < uVar4 + pSVar7->nbBytesLocked) {
              if ((lockAction == USER_LOCK_RGN) ||
                 ((pSVar7->lockType == USER_LOCK_RGN &&
                  ((pSVar7->pvControllerInstance != pvControllerInstance ||
                   (pSVar7->processId != DVar1)))))) goto LAB_0012aa26;
              if (pSVar7->next == 0) {
                pSVar3 = (SHMFILELOCKRGNS *)0x0;
                bVar8 = false;
              }
              else {
                pSVar3 = (SHMFILELOCKRGNS *)SHMPtrToPtr(pSVar7->next);
                bVar8 = pSVar3 == (SHMFILELOCKRGNS *)0x0;
              }
              if (bVar8) {
                uVar6 = 0x212;
                goto LAB_0012a804;
              }
              pSVar5 = pSVar7;
              if ((pSVar3 == (SHMFILELOCKRGNS *)0x0) ||
                 (uVar4 = pSVar3->lockRgnStart, pSVar7 = pSVar3, fakeLock.next <= uVar4)) break;
            }
          }
        }
        do {
          if (((pSVar3 == (SHMFILELOCKRGNS *)0x0) ||
              (nbBytesToLock + lockRgnStart <= pSVar3->lockRgnStart)) ||
             (pSVar3->lockRgnStart + pSVar3->nbBytesLocked <= lockRgnStart)) {
            pSVar3 = (SHMFILELOCKRGNS *)0x0;
            if (pSVar5 != (SHMFILELOCKRGNS *)auStack_78) {
              pSVar3 = pSVar5;
            }
            goto LAB_0012aa12;
          }
          if ((lockAction == USER_LOCK_RGN) ||
             ((pSVar3->lockType == USER_LOCK_RGN &&
              ((pSVar3->pvControllerInstance != pvControllerInstance || (pSVar3->processId != DVar1)
               ))))) goto LAB_0012aa26;
          if (pSVar3->next == 0) {
            pSVar3 = (SHMFILELOCKRGNS *)0x0;
            bVar8 = false;
          }
          else {
            pSVar3 = (SHMFILELOCKRGNS *)SHMPtrToPtr(pSVar3->next);
            bVar8 = pSVar3 == (SHMFILELOCKRGNS *)0x0;
          }
        } while (!bVar8);
        uVar6 = 0x22b;
      }
    }
LAB_0012a804:
    fprintf(_stderr,"] %s %s:%d","FILELockFileRegion",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
            ,uVar6);
    fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
    PVar2 = 0x54f;
    goto LAB_0012aa37;
  }
  PVar2 = 0;
  goto LAB_0012aa32;
LAB_0012aa26:
  PVar2 = 0x21;
LAB_0012aa32:
  if (PAL_InitializeChakraCoreCalled == false) {
    abort();
  }
LAB_0012aa37:
  SHMRelease();
  return PVar2;
}

Assistant:

PAL_ERROR
FILELockFileRegion(
    SHMPTR shmFileLocks,
    PVOID pvControllerInstance,
    UINT64 lockRgnStart, 
    UINT64 nbBytesToLock,
    LOCK_TYPE lockAction
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMFILELOCKRGNS *curLock, *prevLock, *insertAfter, 
                     lockRgn, fakeLock = {0,0,0,0};
    SHMFILELOCKS *fileLocks;

    SHMLock();
    
    /* nothing to do if the region to lock is empty */
    if (nbBytesToLock == 0) 
    {
        TRACE("Locking an empty region (%I64d, %I64d)\n", lockRgnStart, nbBytesToLock);
        goto EXIT;
    }
    
    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, fileLocks, shmFileLocks) == FALSE || fileLocks == NULL)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto EXIT;
    }

    if (fileLocks->fileLockedRgns != 0)
    {        
        prevLock = &fakeLock;
        
        if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLock, fileLocks->fileLockedRgns) 
            == FALSE)
        {
            ASSERT("Unable to get pointer from shm pointer.\n");
            palError = ERROR_INTERNAL_ERROR;
            goto EXIT;
        }
        
        lockRgn.lockRgnStart = lockRgnStart;
        lockRgn.nbBytesLocked = nbBytesToLock;
        lockRgn.pvControllerInstance = pvControllerInstance;
        lockRgn.processId = GetCurrentProcessId();
        lockRgn.lockType = lockAction;

        while((curLock != NULL) && IS_LOCK_BEFORE(curLock, &lockRgn))
        {            
            prevLock = curLock; 
            if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLock, curLock->next) == FALSE)
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                palError = ERROR_INTERNAL_ERROR;
                goto EXIT;
            }
        }
                
        while((curLock != NULL) && IS_LOCK_INTERSECT(curLock, &lockRgn))
        {
            /* we couldn't lock the requested region if it overlap with other 
               region locked explicitly (by LockFile call) by other file pointer */
            if ((lockAction == USER_LOCK_RGN) || 
                ((curLock->lockType  == USER_LOCK_RGN) && 
                 !IS_LOCK_HAVE_SAME_OWNER(curLock, &lockRgn)))
            {
                WARN("The requested lock region overlaps an existing locked region\n");
                palError = ERROR_LOCK_VIOLATION;
                goto EXIT;
            }
            
            prevLock = curLock; 
            if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLock, curLock->next) == FALSE)
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                palError = ERROR_INTERNAL_ERROR;
                goto EXIT;
            }
        }
        
        /* save the previous lock in case we need to insert the requested lock */
        insertAfter = prevLock;         
                
        while(((curLock != NULL) && IS_LOCK_INTERSECT(&lockRgn, curLock)))
        {
            /* we couldn't lock the requested region if it overlap with other region 
               locked explicitly (by LockFile call) by other file pointer */
            if ((lockAction == USER_LOCK_RGN) || 
                ((curLock->lockType  == USER_LOCK_RGN) &&  
                 !IS_LOCK_HAVE_SAME_OWNER(curLock, &lockRgn)))
            {
                WARN("The requested lock region overlaps an existing locked region\n");
                palError = ERROR_LOCK_VIOLATION;
                goto EXIT;
            }
            
            prevLock = curLock; 
            if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLock, curLock->next) == FALSE)
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                palError = ERROR_INTERNAL_ERROR;
                goto EXIT;
            }
        }
       
        if (insertAfter == &fakeLock) 
        {
            insertAfter = NULL;
        }

        palError = FILEAddNewLockedRgn(
            fileLocks,
            pvControllerInstance,
            insertAfter,
            lockRgnStart,
            nbBytesToLock,
            lockAction
            );

        if (NO_ERROR != palError)
        {
            WARN("Couldn't add the new locked region into SHM\n");
            goto EXIT;
        }
    }
    else /* lock region list is empty. */
    {
        palError = FILEAddNewLockedRgn(
            fileLocks,
            pvControllerInstance,
            NULL,
            lockRgnStart,
            nbBytesToLock,
            lockAction
            );
        
        if (NO_ERROR != palError)
        {
            ERROR("Couldn't add the first file locked region \n");
            goto EXIT;
        }
    }  

EXIT:
    SHMRelease();
    return palError;
}